

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any_tests.cpp
# Opt level: O2

void string(void)

{
  Assert local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  stringstream ss;
  ostream local_180 [376];
  
  s_abi_cxx11_(&s,"Hello, World",0xc);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::operator<<(local_180,(string *)&s);
  local_1e0.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/stream_any_tests.cpp"
  ;
  local_1e0.m_line = 0x13;
  std::__cxx11::stringbuf::str();
  UnitTests::Assert::Equals<char[13],std::__cxx11::string>
            (&local_1e0,(char (*) [13])"Hello, World",&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

TEST(string)
{
    auto s{"Hello, World"s};
    auto ss = std::stringstream{};
    ss << UnitTests::stream_any(s);
    ASSERT_EQUALS("Hello, World", ss.str());
}